

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_part.c
# Opt level: O2

REF_STATUS ref_part_cad_association(REF_GRID_conflict ref_grid,char *filename)

{
  int iVar1;
  REF_MPI ref_mpi;
  REF_NODE pRVar2;
  REF_GEOM ref_geom;
  REF_FILEPOS RVar3;
  int iVar4;
  REF_STATUS RVar5;
  uint uVar6;
  size_t sVar7;
  FILE *__stream;
  __off_t _Var8;
  undefined8 uVar9;
  char *pcVar10;
  REF_BOOL available;
  REF_INT version;
  FILE *local_540;
  REF_FILEPOS next_position;
  REF_LONG ngeom;
  REF_NODE local_528;
  REF_INT dim;
  REF_FILEPOS key_pos [156];
  
  ref_mpi = ref_grid->mpi;
  pRVar2 = ref_grid->node;
  ref_geom = ref_grid->geom;
  next_position = -1;
  sVar7 = strlen(filename);
  iVar4 = strcmp(filename + (sVar7 - 6),".meshb");
  if (iVar4 != 0) {
    pcVar10 = "expected .meshb extension";
    RVar5 = 3;
    uVar9 = 0x3b3;
    goto LAB_0016e518;
  }
  local_528 = pRVar2;
  if (ref_mpi->id == 0) {
    RVar5 = ref_import_meshb_header(filename,&version,key_pos);
    if (RVar5 != 0) {
      pcVar10 = "header";
      uVar9 = 0x3b7;
      goto LAB_0016e518;
    }
    __stream = fopen(filename,"r");
    if (__stream == (FILE *)0x0) {
      printf("unable to open %s\n",filename);
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x3bc,
             "ref_part_cad_association","unable to open file");
      return 2;
    }
    RVar5 = ref_import_meshb_jump((FILE *)__stream,version,key_pos,3,&available,&next_position);
    if (RVar5 != 0) {
      pcVar10 = "jump";
      uVar9 = 0x3bf;
      goto LAB_0016e518;
    }
    if (available == 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x3c0,
             "ref_part_cad_association","meshb missing dimension");
      return 1;
    }
    sVar7 = fread(&dim,4,1,__stream);
    if (sVar7 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x3c1,
             "ref_part_cad_association","dim",1,sVar7);
      return 1;
    }
  }
  else {
    __stream = (FILE *)0x0;
  }
  RVar5 = ref_mpi_bcast(ref_mpi,&version,1,1);
  if (RVar5 == 0) {
    RVar5 = ref_geom_initialize(ref_geom);
    if (RVar5 == 0) {
      iVar4 = 0;
      local_540 = __stream;
      do {
        iVar1 = ref_grid->mpi->id;
        if (iVar4 == 3) {
          if (iVar1 == 0) {
            fclose(local_540);
            return 0;
          }
          return 0;
        }
        if (iVar1 == 0) {
          uVar6 = ref_import_meshb_jump
                            ((FILE *)local_540,version,key_pos,iVar4 + 0x28,&available,
                             &next_position);
          if (uVar6 != 0) {
            pcVar10 = "jump";
            uVar9 = 0x3cd;
            goto LAB_0016e8cd;
          }
          if ((available != 0) &&
             (RVar5 = ref_part_meshb_long((FILE *)local_540,version,&ngeom), RVar5 != 0)) {
            pcVar10 = "ngeom";
            RVar5 = 1;
            uVar9 = 0x3cf;
            goto LAB_0016e518;
          }
        }
        uVar6 = ref_mpi_bcast(ref_mpi,&available,1,1);
        if (uVar6 != 0) {
          pcVar10 = "bcast";
          uVar9 = 0x3d3;
          goto LAB_0016e8cd;
        }
        if (available != 0) {
          uVar6 = ref_mpi_bcast(ref_mpi,&ngeom,1,2);
          if (uVar6 != 0) {
            pcVar10 = "bcast";
            uVar9 = 0x3d5;
LAB_0016e8cd:
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   uVar9,"ref_part_cad_association",(ulong)uVar6,pcVar10);
            return uVar6;
          }
          uVar6 = ref_part_meshb_geom_bcast
                            (ref_geom,ngeom,iVar4,local_528,version,(FILE *)local_540);
          RVar3 = next_position;
          if (uVar6 != 0) {
            pcVar10 = "part geom bcast";
            uVar9 = 0x3d8;
            goto LAB_0016e8cd;
          }
          if ((ref_grid->mpi->id == 0) && (_Var8 = ftello(local_540), RVar3 != _Var8)) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   0x3da,"ref_part_cad_association","end location",RVar3,_Var8);
            return 1;
          }
        }
        iVar4 = iVar4 + 1;
      } while( true );
    }
    pcVar10 = "clear out previous assoc";
    uVar9 = 0x3c6;
  }
  else {
    pcVar10 = "bcast";
    uVar9 = 0x3c4;
  }
LAB_0016e518:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar9,
         "ref_part_cad_association",RVar5,pcVar10);
  return RVar5;
}

Assistant:

REF_FCN REF_STATUS ref_part_cad_association(REF_GRID ref_grid,
                                            const char *filename) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  FILE *file;
  REF_INT version, dim;
  REF_BOOL available;
  REF_FILEPOS next_position = REF_EMPTY;
  REF_FILEPOS key_pos[REF_IMPORT_MESHB_LAST_KEYWORD];
  REF_INT type, geom_keyword;
  REF_LONG ngeom;
  REF_BOOL verbose = REF_FALSE;
  size_t end_of_string;

  end_of_string = strlen(filename);

  if (strcmp(&filename[end_of_string - 6], ".meshb") != 0)
    RSS(REF_INVALID, "expected .meshb extension");

  file = NULL;
  if (ref_mpi_once(ref_mpi)) {
    RSS(ref_import_meshb_header(filename, &version, key_pos), "header");
    if (verbose) printf("meshb version %d\n", version);
    if (verbose) printf("open %s\n", filename);
    file = fopen(filename, "r");
    if (NULL == (void *)file) printf("unable to open %s\n", filename);
    RNS(file, "unable to open file");
    RSS(ref_import_meshb_jump(file, version, key_pos, 3, &available,
                              &next_position),
        "jump");
    RAS(available, "meshb missing dimension");
    REIS(1, fread((unsigned char *)&dim, 4, 1, file), "dim");
    if (verbose) printf("meshb dim %d\n", dim);
  }
  RSS(ref_mpi_bcast(ref_mpi, &version, 1, REF_INT_TYPE), "bcast");

  RSS(ref_geom_initialize(ref_geom), "clear out previous assoc");

  each_ref_type(ref_geom, type) {
    if (ref_grid_once(ref_grid)) {
      geom_keyword = 40 + type;
      RSS(ref_import_meshb_jump(file, version, key_pos, geom_keyword,
                                &available, &next_position),
          "jump");
      if (available) {
        RSS(ref_part_meshb_long(file, version, &ngeom), "ngeom");
        if (verbose) printf("type %d ngeom %ld\n", type, ngeom);
      }
    }
    RSS(ref_mpi_bcast(ref_mpi, &available, 1, REF_INT_TYPE), "bcast");
    if (available) {
      RSS(ref_mpi_bcast(ref_mpi, &ngeom, 1, REF_LONG_TYPE), "bcast");
      RSS(ref_part_meshb_geom_bcast(ref_geom, ngeom, type, ref_node, version,
                                    file),
          "part geom bcast");
      if (ref_grid_once(ref_grid))
        REIS(next_position, ftello(file), "end location");
    }
  }

  if (ref_grid_once(ref_grid)) {
    fclose(file);
  }

  return REF_SUCCESS;
}